

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

int validate_retry_tag(quicly_decoded_packet_t *packet,quicly_cid_t *odcid,
                      ptls_aead_context_t *retry_aead)

{
  byte bVar1;
  void *__src;
  size_t __n;
  long lVar2;
  ptls_aead_context_t *__src_00;
  size_t sVar3;
  size_t *psVar4;
  undefined1 *__dest;
  long alStack_60 [3];
  undefined8 uStack_48;
  size_t *local_40;
  long local_38;
  unsigned_long __vla_expr0;
  long local_28;
  size_t pseudo_packet_len;
  ptls_aead_context_t *retry_aead_local;
  quicly_cid_t *odcid_local;
  quicly_decoded_packet_t *packet_local;
  
  __vla_expr0 = (unsigned_long)&uStack_48;
  local_38 = (ulong)odcid->len + 1 + packet->encrypted_off;
  lVar2 = -(local_38 + 0xfU & 0xfffffffffffffff0);
  psVar4 = (size_t *)((long)&uStack_48 + lVar2);
  local_40 = psVar4;
  local_28 = local_38;
  pseudo_packet_len = (size_t)retry_aead;
  retry_aead_local = (ptls_aead_context_t *)odcid;
  odcid_local = (quicly_cid_t *)packet;
  *(uint8_t *)psVar4 = odcid->len;
  __src_00 = retry_aead_local;
  bVar1 = *(byte *)((long)&retry_aead_local->do_xor_iv + 4);
  *(undefined8 *)((long)alStack_60 + lVar2 + 0x10) = 0x14a954;
  memcpy((undefined1 *)((long)&uStack_48 + lVar2 + 1U),__src_00,(ulong)bVar1);
  __dest = (undefined1 *)
           ((long)local_40 + (long)(int)(uint)*(byte *)((long)&retry_aead_local->do_xor_iv + 4) + 1)
  ;
  __src = *(void **)odcid_local->cid;
  __n = *(size_t *)(odcid_local[4].cid + 0xc);
  *(undefined8 *)((long)alStack_60 + lVar2 + 0x10) = 0x14a97d;
  memcpy(__dest,__src,__n);
  *(long *)((long)alStack_60 + lVar2 + 8) = local_28;
  *(undefined8 *)((long)alStack_60 + lVar2) = 0x14a9bc;
  sVar3 = ptls_aead_decrypt(*(ptls_aead_context_t **)((long)&__vla_expr0 + lVar2),
                            *(void **)((long)&local_38 + lVar2),*(void **)((long)&local_40 + lVar2),
                            *psVar4,*(uint64_t *)((long)alStack_60 + lVar2 + 0x10),
                            *(void **)((long)alStack_60 + lVar2 + 8),
                            *(size_t *)((long)&pseudo_packet_len + lVar2));
  return (int)(sVar3 == 0);
}

Assistant:

static int validate_retry_tag(quicly_decoded_packet_t *packet, quicly_cid_t *odcid, ptls_aead_context_t *retry_aead)
{
    size_t pseudo_packet_len = 1 + odcid->len + packet->encrypted_off;
    uint8_t pseudo_packet[pseudo_packet_len];
    pseudo_packet[0] = odcid->len;
    memcpy(pseudo_packet + 1, odcid->cid, odcid->len);
    memcpy(pseudo_packet + 1 + odcid->len, packet->octets.base, packet->encrypted_off);
    return ptls_aead_decrypt(retry_aead, packet->octets.base + packet->encrypted_off, packet->octets.base + packet->encrypted_off,
                             PTLS_AESGCM_TAG_SIZE, 0, pseudo_packet, pseudo_packet_len) == 0;
}